

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O3

void __thiscall
llvm::DWARFDie::getCallerFrame
          (DWARFDie *this,uint32_t *CallFile,uint32_t *CallLine,uint32_t *CallColumn,
          uint32_t *CallDiscriminator)

{
  uint32_t uVar1;
  Optional<unsigned_long> OVar2;
  Optional<llvm::DWARFFormValue> local_78;
  uint32_t *local_40;
  uint32_t *local_38;
  
  local_40 = CallDiscriminator;
  local_38 = CallColumn;
  find(&local_78,this,DW_AT_call_file);
  uVar1 = 0;
  if (local_78.Storage.hasVal == true) {
    OVar2 = DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)&local_78);
    uVar1 = 0;
    if (((undefined1  [16])OVar2.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar1 = OVar2.Storage.field_0._0_4_;
    }
  }
  *CallFile = uVar1;
  find(&local_78,this,DW_AT_call_line);
  uVar1 = 0;
  if (local_78.Storage.hasVal == true) {
    OVar2 = DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)&local_78);
    uVar1 = 0;
    if (((undefined1  [16])OVar2.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar1 = OVar2.Storage.field_0._0_4_;
    }
  }
  *CallLine = uVar1;
  find(&local_78,this,DW_AT_call_column);
  uVar1 = 0;
  if (local_78.Storage.hasVal == true) {
    OVar2 = DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)&local_78);
    uVar1 = 0;
    if (((undefined1  [16])OVar2.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar1 = OVar2.Storage.field_0._0_4_;
    }
  }
  *local_38 = uVar1;
  find(&local_78,this,DW_AT_GNU_discriminator);
  uVar1 = 0;
  if (local_78.Storage.hasVal == true) {
    OVar2 = DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)&local_78);
    uVar1 = 0;
    if (((undefined1  [16])OVar2.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar1 = OVar2.Storage.field_0._0_4_;
    }
  }
  *local_40 = uVar1;
  return;
}

Assistant:

void DWARFDie::getCallerFrame(uint32_t &CallFile, uint32_t &CallLine,
                              uint32_t &CallColumn,
                              uint32_t &CallDiscriminator) const {
  CallFile = toUnsigned(find(DW_AT_call_file), 0);
  CallLine = toUnsigned(find(DW_AT_call_line), 0);
  CallColumn = toUnsigned(find(DW_AT_call_column), 0);
  CallDiscriminator = toUnsigned(find(DW_AT_GNU_discriminator), 0);
}